

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O0

int __thiscall SafeQueue<int>::pop(SafeQueue<int> *this)

{
  int iVar1;
  reference pvVar2;
  int val;
  lock_guard<std::mutex> lk;
  SafeQueue<int> *this_local;
  
  lk._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffe8,&this->m_mtx);
  pvVar2 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front(&this->m_queue);
  iVar1 = *pvVar2;
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->m_queue);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffe8);
  return iVar1;
}

Assistant:

virtual T pop()
    {
        std::lock_guard lk(m_mtx);

        T val = m_queue.front();
        m_queue.pop();

        return val;
    }